

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O2

void __thiscall
cmGlobalUnixMakefileGenerator3::WriteDirectoryRule2
          (cmGlobalUnixMakefileGenerator3 *this,ostream *ruleFileStream,
          cmLocalUnixMakefileGenerator3 *lg,char *pass,bool check_all,bool check_relink,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *commands)

{
  pointer ppcVar1;
  cmGeneratorTarget *this_00;
  cmLocalCommonGenerator *pcVar2;
  bool bVar3;
  TargetType TVar4;
  string *psVar5;
  char cVar6;
  pointer ppcVar7;
  pointer this_01;
  undefined7 in_register_00000089;
  allocator<char> local_121;
  cmLocalUnixMakefileGenerator3 *local_120;
  undefined4 local_114;
  char *local_110;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  string doc;
  _Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> local_a8;
  string makeTarget;
  string subdir;
  string local_50;
  
  local_114 = (undefined4)CONCAT71(in_register_00000089,check_relink);
  local_120 = lg;
  psVar5 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)lg);
  std::__cxx11::string::string((string *)&makeTarget,(string *)psVar5);
  std::__cxx11::string::push_back((char)&makeTarget);
  std::__cxx11::string::append((char *)&makeTarget);
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ppcVar7 = (local_120->super_cmLocalCommonGenerator).super_cmLocalGenerator.GeneratorTargets.
            super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppcVar1 = (local_120->super_cmLocalCommonGenerator).super_cmLocalGenerator.GeneratorTargets.
            super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  cVar6 = (char)local_114;
  pcVar2 = &local_120->super_cmLocalCommonGenerator;
  local_110 = pass;
  do {
    if (ppcVar7 == ppcVar1) {
      cmLocalGenerator::GetStateSnapshot((cmStateSnapshot *)&doc,(cmLocalGenerator *)local_120);
      cmStateSnapshot::GetChildren
                ((vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *)&local_a8,
                 (cmStateSnapshot *)&doc);
      for (this_01 = local_a8._M_impl.super__Vector_impl_data._M_start;
          this_01 != local_a8._M_impl.super__Vector_impl_data._M_finish; this_01 = this_01 + 1) {
        cmStateSnapshot::GetDirectory((cmStateDirectory *)&doc,this_01);
        psVar5 = cmStateDirectory::GetCurrentBinary_abi_cxx11_((cmStateDirectory *)&doc);
        std::__cxx11::string::string((string *)&subdir,(string *)psVar5);
        std::__cxx11::string::push_back((char)&subdir);
        std::__cxx11::string::append((char *)&subdir);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&depends,
                   &subdir);
        std::__cxx11::string::~string((string *)&subdir);
      }
      std::_Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>::~_Vector_base(&local_a8)
      ;
      if ((depends.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start ==
           depends.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish) &&
         ((this->EmptyRuleHackDepends)._M_string_length != 0)) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&depends,&this->EmptyRuleHackDepends);
      }
      doc._M_dataplus._M_p = (pointer)&doc.field_2;
      doc._M_string_length = 0;
      doc.field_2._M_local_buf[0] = '\0';
      bVar3 = cmLocalGenerator::IsRootMakefile((cmLocalGenerator *)local_120);
      if (bVar3) {
        std::__cxx11::string::assign((char *)&doc);
        std::__cxx11::string::append((char *)&doc);
      }
      else {
        std::__cxx11::string::assign((char *)&doc);
        std::__cxx11::string::append((char *)&doc);
      }
      std::__cxx11::string::append((char *)&doc);
      cmLocalUnixMakefileGenerator3::WriteMakeRule
                (local_120,ruleFileStream,doc._M_dataplus._M_p,&makeTarget,&depends,commands,true,
                 false);
      std::__cxx11::string::~string((string *)&doc);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&depends);
      std::__cxx11::string::~string((string *)&makeTarget);
      return;
    }
    this_00 = *ppcVar7;
    TVar4 = cmGeneratorTarget::GetType(this_00);
    if (TVar4 < GLOBAL_TARGET) {
      if (check_all) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,"EXCLUDE_FROM_ALL",&local_121);
        bVar3 = cmGeneratorTarget::GetPropertyAsBool(this_00,&local_50);
        if (bVar3 || cVar6 != '\x01') {
          bVar3 = !bVar3;
LAB_002ac61c:
          std::__cxx11::string::~string((string *)&local_50);
        }
        else {
LAB_002ac602:
          bVar3 = cmGeneratorTarget::NeedRelinkBeforeInstall(this_00,&pcVar2->ConfigName);
          if (check_all) goto LAB_002ac61c;
        }
        if (bVar3 == false) goto LAB_002ac66a;
      }
      else if ((char)local_114 != '\0') goto LAB_002ac602;
      cmLocalUnixMakefileGenerator3::GetRelativeTargetDirectory_abi_cxx11_(&doc,local_120,this_00);
      std::__cxx11::string::append((char *)&doc);
      std::__cxx11::string::append((char *)&doc);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&depends,&doc)
      ;
      std::__cxx11::string::~string((string *)&doc);
    }
LAB_002ac66a:
    ppcVar7 = ppcVar7 + 1;
  } while( true );
}

Assistant:

void cmGlobalUnixMakefileGenerator3::WriteDirectoryRule2(
  std::ostream& ruleFileStream, cmLocalUnixMakefileGenerator3* lg,
  const char* pass, bool check_all, bool check_relink,
  std::vector<std::string> const& commands)
{
  // Get the relative path to the subdirectory from the top.
  std::string makeTarget = lg->GetCurrentBinaryDirectory();
  makeTarget += '/';
  makeTarget += pass;

  // The directory-level rule should depend on the target-level rules
  // for all targets in the directory.
  std::vector<std::string> depends;
  for (cmGeneratorTarget* gtarget : lg->GetGeneratorTargets()) {
    int type = gtarget->GetType();
    if ((type == cmStateEnums::EXECUTABLE) ||
        (type == cmStateEnums::STATIC_LIBRARY) ||
        (type == cmStateEnums::SHARED_LIBRARY) ||
        (type == cmStateEnums::MODULE_LIBRARY) ||
        (type == cmStateEnums::OBJECT_LIBRARY) ||
        (type == cmStateEnums::UTILITY)) {
      // Add this to the list of depends rules in this directory.
      if ((!check_all || !gtarget->GetPropertyAsBool("EXCLUDE_FROM_ALL")) &&
          (!check_relink ||
           gtarget->NeedRelinkBeforeInstall(lg->GetConfigName()))) {
        std::string tname = lg->GetRelativeTargetDirectory(gtarget);
        tname += "/";
        tname += pass;
        depends.push_back(std::move(tname));
      }
    }
  }

  // The directory-level rule should depend on the directory-level
  // rules of the subdirectories.
  for (cmStateSnapshot const& c : lg->GetStateSnapshot().GetChildren()) {
    std::string subdir = c.GetDirectory().GetCurrentBinary();
    subdir += '/';
    subdir += pass;
    depends.push_back(std::move(subdir));
  }

  // Work-around for makes that drop rules that have no dependencies
  // or commands.
  if (depends.empty() && !this->EmptyRuleHackDepends.empty()) {
    depends.push_back(this->EmptyRuleHackDepends);
  }

  // Write the rule.
  std::string doc;
  if (lg->IsRootMakefile()) {
    doc = "The main recursive \"";
    doc += pass;
    doc += "\" target.";
  } else {
    doc = "Recursive \"";
    doc += pass;
    doc += "\" directory target.";
  }
  lg->WriteMakeRule(ruleFileStream, doc.c_str(), makeTarget, depends, commands,
                    true);
}